

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRMiner.cpp
# Opt level: O0

void dgrminer::getFrequentInitialPatterns
               (set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
                *edges_set,
               vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
               *initial_patterns,
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *initial_patterns_occurrences,int support_as_absolute,bool set_of_graphs,
               PartialUnion *pu)

{
  int *piVar1;
  bool bVar2;
  bool bVar3;
  reference plVar4;
  reference piVar5;
  size_type sVar6;
  size_t sVar7;
  reference pvVar8;
  iterator iVar9;
  iterator iVar10;
  back_insert_iterator<std::vector<int,_std::allocator<int>_>_> bVar11;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar12;
  undefined1 local_1d8 [8];
  vector<int,_std::allocator<int>_> occs_1;
  undefined1 local_188 [8];
  vector<int,_std::allocator<int>_> occs;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> local_168;
  _Base_ptr local_150;
  undefined1 local_148;
  int local_12c;
  _Self local_128;
  _Base_ptr local_120;
  _Rb_tree_const_iterator<int> local_118;
  iterator it2;
  set<int,_std::less<int>,_std::allocator<int>_> mapped_occurrences;
  labeled_edge_with_occurrences f;
  iterator __end1;
  iterator __begin1;
  set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  *__range1;
  PartialUnion *pu_local;
  bool set_of_graphs_local;
  int support_as_absolute_local;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *initial_patterns_occurrences_local;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *initial_patterns_local;
  set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  *edges_set_local;
  
  __end1 = std::
           set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
           ::begin(edges_set);
  f.multiple_occurrences._M_h._M_single_bucket =
       (__node_base_ptr)
       std::
       set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
       ::end(edges_set);
  do {
    bVar2 = std::operator!=(&__end1,(_Self *)&f.multiple_occurrences._M_h._M_single_bucket);
    if (!bVar2) {
      return;
    }
    plVar4 = std::_Rb_tree_const_iterator<dgrminer::labeled_edge_with_occurrences>::operator*
                       (&__end1);
    labeled_edge_with_occurrences::labeled_edge_with_occurrences
              ((labeled_edge_with_occurrences *)
               &mapped_occurrences._M_t._M_impl.super__Rb_tree_header._M_node_count,plVar4);
    if (set_of_graphs) {
      std::set<int,_std::less<int>,_std::allocator<int>_>::set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)&it2);
      std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(&local_118);
      local_120 = (_Base_ptr)
                  std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)
                             (f.elements._M_elems + 6));
      local_118._M_node = local_120;
      while( true ) {
        local_128._M_node =
             (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::end
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)(f.elements._M_elems + 6))
        ;
        bVar2 = std::operator!=(&local_118,&local_128);
        if (!bVar2) break;
        piVar5 = std::_Rb_tree_const_iterator<int>::operator*(&local_118);
        local_12c = PartialUnion::queryMappingSnapshotsToGraphs(pu,*piVar5);
        pVar12 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)&it2,&local_12c);
        local_150 = (_Base_ptr)pVar12.first._M_node;
        local_148 = pVar12.second;
        std::_Rb_tree_const_iterator<int>::operator++(&local_118);
      }
      occs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._7_1_ = 0;
      bVar2 = PartialUnion::getNewMeasures(pu);
      if ((bVar2) ||
         (sVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)&it2),
         (int)sVar6 < support_as_absolute)) {
        bVar3 = PartialUnion::getNewMeasures(pu);
        bVar2 = false;
        if (bVar3) {
          PartialUnion::getEdges(&local_168,pu);
          occs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._7_1_ = 1;
          bVar2 = PartialUnion::getHeuristicMIS(pu);
          sVar7 = labeled_edge_with_occurrences::support
                            ((labeled_edge_with_occurrences *)
                             &mapped_occurrences._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             &local_168,true,bVar2);
          bVar2 = false;
          if (support_as_absolute <= (int)sVar7) goto LAB_0010752c;
        }
      }
      else {
LAB_0010752c:
        pvVar8 = std::array<int,_8UL>::operator[]
                           ((array<int,_8UL> *)
                            &mapped_occurrences._M_t._M_impl.super__Rb_tree_header._M_node_count,1);
        bVar2 = true;
        if (*pvVar8 < 0) {
          pvVar8 = std::array<int,_8UL>::operator[]
                             ((array<int,_8UL> *)
                              &mapped_occurrences._M_t._M_impl.super__Rb_tree_header._M_node_count,4
                             );
          bVar2 = true;
          if (*pvVar8 < 0) {
            pvVar8 = std::array<int,_8UL>::operator[]
                               ((array<int,_8UL> *)
                                &mapped_occurrences._M_t._M_impl.super__Rb_tree_header._M_node_count
                                ,6);
            bVar2 = -1 < *pvVar8;
          }
        }
      }
      if ((occs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._7_1_ & 1) != 0) {
        std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~vector
                  (&local_168);
      }
      if (bVar2) {
        std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::push_back
                  (initial_patterns,
                   (value_type *)
                   &mapped_occurrences._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_188);
        piVar1 = f.elements._M_elems + 6;
        iVar9 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)piVar1);
        iVar10 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)piVar1);
        bVar11 = std::back_inserter<std::vector<int,std::allocator<int>>>
                           ((vector<int,_std::allocator<int>_> *)local_188);
        std::
        copy<std::_Rb_tree_const_iterator<int>,std::back_insert_iterator<std::vector<int,std::allocator<int>>>>
                  ((_Rb_tree_const_iterator<int>)iVar9._M_node,
                   (_Rb_tree_const_iterator<int>)iVar10._M_node,bVar11);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::push_back(initial_patterns_occurrences,(value_type *)local_188);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_188);
      }
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)&it2);
    }
    else {
      PartialUnion::getEdges
                ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                 &occs_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,pu);
      bVar2 = PartialUnion::getNewMeasures(pu);
      bVar3 = PartialUnion::getHeuristicMIS(pu);
      sVar7 = labeled_edge_with_occurrences::support
                        ((labeled_edge_with_occurrences *)
                         &mapped_occurrences._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                         &occs_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,bVar2,bVar3);
      bVar2 = false;
      if (support_as_absolute <= (int)sVar7) {
        pvVar8 = std::array<int,_8UL>::operator[]
                           ((array<int,_8UL> *)
                            &mapped_occurrences._M_t._M_impl.super__Rb_tree_header._M_node_count,1);
        bVar2 = true;
        if (*pvVar8 < 0) {
          pvVar8 = std::array<int,_8UL>::operator[]
                             ((array<int,_8UL> *)
                              &mapped_occurrences._M_t._M_impl.super__Rb_tree_header._M_node_count,4
                             );
          bVar2 = true;
          if (*pvVar8 < 0) {
            pvVar8 = std::array<int,_8UL>::operator[]
                               ((array<int,_8UL> *)
                                &mapped_occurrences._M_t._M_impl.super__Rb_tree_header._M_node_count
                                ,6);
            bVar2 = -1 < *pvVar8;
          }
        }
      }
      std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~vector
                ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                 &occs_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      if (bVar2) {
        std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::push_back
                  (initial_patterns,
                   (value_type *)
                   &mapped_occurrences._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_1d8);
        piVar1 = f.elements._M_elems + 6;
        iVar9 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)piVar1);
        iVar10 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)piVar1);
        bVar11 = std::back_inserter<std::vector<int,std::allocator<int>>>
                           ((vector<int,_std::allocator<int>_> *)local_1d8);
        std::
        copy<std::_Rb_tree_const_iterator<int>,std::back_insert_iterator<std::vector<int,std::allocator<int>>>>
                  ((_Rb_tree_const_iterator<int>)iVar9._M_node,
                   (_Rb_tree_const_iterator<int>)iVar10._M_node,bVar11);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::push_back(initial_patterns_occurrences,(value_type *)local_1d8);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_1d8);
      }
    }
    labeled_edge_with_occurrences::~labeled_edge_with_occurrences
              ((labeled_edge_with_occurrences *)
               &mapped_occurrences._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::_Rb_tree_const_iterator<dgrminer::labeled_edge_with_occurrences>::operator++(&__end1);
  } while( true );
}

Assistant:

void  getFrequentInitialPatterns(std::set<labeled_edge_with_occurrences> &edges_set,
									std::vector<std::array<int, 8>> &initial_patterns,
									std::vector<std::vector<int>> &initial_patterns_occurrences,
									int support_as_absolute, bool set_of_graphs, PartialUnion &pu)
	{
		for (auto f : edges_set)
		{
			if (set_of_graphs) {
				std::set<int> mapped_occurrences;
				std::set<int>::iterator it2;
				for (it2 = f.occurrences.begin(); it2 != f.occurrences.end(); ++it2)
				{
					mapped_occurrences.insert(pu.queryMappingSnapshotsToGraphs(*it2));
				}
				if (((!pu.getNewMeasures() && static_cast<int>(mapped_occurrences.size()) >= support_as_absolute)
					|| (pu.getNewMeasures() && static_cast<int>(f.support(pu.getEdges(), true, pu.getHeuristicMIS())) >= support_as_absolute)) &&
					(f.elements[ADJ_INFO_SRC_CHANGETIME] >= 0 || f.elements[ADJ_INFO_CHANGETIME] >= 0 ||
					 f.elements[ADJ_INFO_DST_CHANGETIME] >= 0))
				{
					initial_patterns.push_back(f.elements);

					std::vector<int> occs;
					std::copy(f.occurrences.begin(), f.occurrences.end(), std::back_inserter(occs));

					initial_patterns_occurrences.push_back(occs);
				}
			}
			else
			{
				if (static_cast<int>(f.support(pu.getEdges(), pu.getNewMeasures(), pu.getHeuristicMIS())) >= support_as_absolute &&
					(f.elements[ADJ_INFO_SRC_CHANGETIME] >= 0 || f.elements[ADJ_INFO_CHANGETIME] >= 0 ||
					 f.elements[ADJ_INFO_DST_CHANGETIME] >= 0))
				{
					// if the edge represents at least one change
					initial_patterns.push_back(f.elements);

					std::vector<int> occs;
					std::copy(f.occurrences.begin(), f.occurrences.end(), std::back_inserter(occs));

					initial_patterns_occurrences.push_back(occs);
				}
			}
		}
	}